

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall clickhouse::Client::Impl::ExecuteQuery(Impl *this,Query *query)

{
  pointer pcVar1;
  bool bVar2;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this->events_ = &query->super_QueryEvents;
  if ((this->options_).ping_before_query == true) {
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/client.cpp:200:20)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/client.cpp:200:20)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    RetryGuard(this,(function<void_()> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  pcVar1 = (query->query_)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (query->query_)._M_string_length);
  SendQuery(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  do {
    bVar2 = ReceivePacket(this,(uint64_t *)0x0);
  } while (bVar2);
  this->events_ = (QueryEvents *)0x0;
  return;
}

Assistant:

void Client::Impl::ExecuteQuery(Query query) {
    EnsureNull en(static_cast<QueryEvents*>(&query), &events_);

    if (options_.ping_before_query) {
        RetryGuard([this]() { Ping(); });
    }

    SendQuery(query.GetText());

    while (ReceivePacket()) {
        ;
    }
}